

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O0

int __thiscall MeCab::Param::open(Param *this,char *__file,int __oflag,...)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  size_t __n;
  size_t sVar4;
  long in_RCX;
  long lVar5;
  bool bVar6;
  bool hit_1;
  size_t i_2;
  size_t nlen;
  size_t i_1;
  bool hit;
  size_t len;
  char *s;
  size_t i;
  int _errno;
  int ind;
  value_type *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined8 in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  allocator *in_stack_fffffffffffffe48;
  Param *this_00;
  allocator *paVar7;
  char *in_stack_fffffffffffffe68;
  Param *in_stack_fffffffffffffe70;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  char local_119;
  long local_118;
  undefined4 local_110;
  allocator local_109;
  string local_108 [16];
  Option *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  long local_b8;
  char *local_a0;
  allocator local_91;
  string local_90 [32];
  long local_70;
  allocator local_51;
  string local_50 [32];
  int local_30;
  uint local_2c;
  long local_28;
  undefined8 *local_20;
  int local_14;
  Param *local_10;
  undefined1 local_1;
  
  local_14 = (int)__file;
  local_2c = 0;
  local_30 = 0;
  local_28 = in_RCX;
  local_20 = ___oflag;
  local_10 = this;
  if (local_14 < 1) {
    poVar3 = (ostream *)std::__cxx11::string::operator=((string *)&this->system_name_,"unknown");
    local_1 = 1;
  }
  else {
    this_00 = (Param *)*___oflag;
    paVar7 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)this_00,paVar7);
    std::__cxx11::string::operator=((string *)&this->system_name_,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    anon_unknown_2::init_param
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    for (local_70 = 0; *(long *)(local_28 + local_70 * 0x28) != 0; local_70 = local_70 + 1) {
      if (*(long *)(local_28 + local_70 * 0x28 + 0x10) != 0) {
        in_stack_fffffffffffffe38 = *(undefined8 *)(local_28 + local_70 * 0x28);
        in_stack_fffffffffffffe40 = *(int **)(local_28 + 0x10 + local_70 * 0x28);
        in_stack_fffffffffffffe48 = &local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_90,(char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe48);
        set<std::__cxx11::string>
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   SUB81((ulong)paVar7 >> 0x38,0));
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
    }
    for (local_2c = 1; poVar3 = (ostream *)(ulong)local_2c, (int)local_2c < local_14;
        local_2c = local_2c + 1) {
      if (*(char *)local_20[(int)local_2c] == '-') {
        if (*(char *)(local_20[(int)local_2c] + 1) == '-') {
          local_a0 = (char *)(local_20[(int)local_2c] + 2);
          while( true ) {
            bVar6 = false;
            if (*local_a0 != '\0') {
              bVar6 = *local_a0 != '=';
            }
            if (!bVar6) break;
            local_a0 = local_a0 + 1;
          }
          __n = (long)local_a0 - (local_20[(int)local_2c] + 2);
          if (__n == 0) {
            local_1 = 1;
            poVar3 = (ostream *)0x0;
            goto LAB_0017c054;
          }
          bVar6 = false;
          for (local_b8 = 0; *(long *)(local_28 + local_b8 * 0x28) != 0; local_b8 = local_b8 + 1) {
            sVar4 = strlen(*(char **)(local_28 + local_b8 * 0x28));
            if ((sVar4 == __n) &&
               (iVar2 = strncmp((char *)(local_20[(int)local_2c] + 2),
                                *(char **)(local_28 + local_b8 * 0x28),__n), iVar2 == 0)) {
              bVar6 = true;
              break;
            }
          }
          if (!bVar6) {
            local_30 = 0;
LAB_0017bf45:
            if (local_30 == 0) {
              poVar3 = std::operator<<((ostream *)&this->what_,"unrecognized option `");
              poVar3 = std::operator<<(poVar3,(char *)local_20[(int)local_2c]);
              poVar3 = std::operator<<(poVar3,"`");
            }
            else if (local_30 == 1) {
              poVar3 = std::operator<<((ostream *)&this->what_,"`");
              poVar3 = std::operator<<(poVar3,(char *)local_20[(int)local_2c]);
              poVar3 = std::operator<<(poVar3,"` requires an argument");
            }
            else {
              poVar3 = (ostream *)(ulong)(local_30 - 2U);
              if (local_30 - 2U == 0) {
                poVar3 = std::operator<<((ostream *)&this->what_,"`");
                poVar3 = std::operator<<(poVar3,(char *)local_20[(int)local_2c]);
                poVar3 = std::operator<<(poVar3,"` doesn\'t allow an argument");
              }
            }
            local_1 = 0;
            goto LAB_0017c054;
          }
          if (*(long *)(local_28 + local_b8 * 0x28 + 0x18) == 0) {
            if (*local_a0 == '=') {
              local_30 = 2;
              goto LAB_0017bf45;
            }
            local_110 = 1;
            set<int>(this_00,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                     SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
          }
          else if (*local_a0 == '=') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xffffffffffffff20,local_a0 + 1,
                       (allocator *)&stack0xffffffffffffff1f);
            set<std::__cxx11::string>
                      (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       SUB81((ulong)paVar7 >> 0x38,0));
            std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
          }
          else {
            if (local_14 == local_2c + 1) {
              local_30 = 1;
              goto LAB_0017bf45;
            }
            lVar5 = (long)(int)local_2c;
            local_2c = local_2c + 1;
            pcVar1 = (char *)local_20[lVar5 + 1];
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_108,pcVar1,&local_109);
            set<std::__cxx11::string>
                      (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       SUB81((ulong)paVar7 >> 0x38,0));
            std::__cxx11::string::~string(local_108);
            std::allocator<char>::~allocator((allocator<char> *)&local_109);
          }
        }
        else if (*(char *)(local_20[(int)local_2c] + 1) != '\0') {
          local_119 = '\0';
          for (local_118 = 0; *(long *)(local_28 + local_118 * 0x28) != 0; local_118 = local_118 + 1
              ) {
            if (*(char *)(local_28 + local_118 * 0x28 + 8) == *(char *)(local_20[(int)local_2c] + 1)
               ) {
              local_119 = '\x01';
              break;
            }
          }
          if (local_119 == '\0') {
            local_30 = 0;
            goto LAB_0017bf45;
          }
          if (*(long *)(local_28 + local_118 * 0x28 + 0x18) == 0) {
            if (*(char *)(local_20[(int)local_2c] + 2) != '\0') {
              local_30 = 2;
              goto LAB_0017bf45;
            }
            set<int>(this_00,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                     SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
          }
          else if (*(char *)(local_20[(int)local_2c] + 2) == '\0') {
            if (local_14 == local_2c + 1) {
              local_30 = 1;
              goto LAB_0017bf45;
            }
            lVar5 = (long)(int)local_2c;
            local_2c = local_2c + 1;
            pcVar1 = (char *)local_20[lVar5 + 1];
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_168,pcVar1,&local_169);
            set<std::__cxx11::string>
                      (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       SUB81((ulong)paVar7 >> 0x38,0));
            std::__cxx11::string::~string(local_168);
            std::allocator<char>::~allocator((allocator<char> *)&local_169);
          }
          else {
            lVar5 = local_20[(int)local_2c];
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_140,(char *)(lVar5 + 2),&local_141);
            set<std::__cxx11::string>
                      (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       SUB81((ulong)paVar7 >> 0x38,0));
            std::__cxx11::string::~string(local_140);
            std::allocator<char>::~allocator((allocator<char> *)&local_141);
          }
        }
      }
      else {
        pcVar1 = (char *)local_20[(int)local_2c];
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffe70,pcVar1,(allocator *)&stack0xfffffffffffffe6f);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    in_stack_fffffffffffffda8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe6f);
      }
    }
    local_1 = 1;
  }
LAB_0017c054:
  return (int)CONCAT71((int7)((ulong)poVar3 >> 8),local_1);
}

Assistant:

bool Param::open(int argc, char **argv, const Option *opts) {
  int ind = 0;
  int _errno = 0;

#define GOTO_ERROR(n) {                         \
    _errno = n;                                 \
    goto ERROR; } while (0)

  if (argc <= 0) {
    system_name_ = "unknown";
    return true;  // this is not error
  }

  system_name_ = std::string(argv[0]);

  init_param(&help_, &version_, system_name_, opts);

  for (size_t i = 0; opts[i].name; ++i) {
    if (opts[i].default_value) set<std::string>
                                   (opts[i].name, opts[i].default_value);
  }

  for (ind = 1; ind < argc; ind++) {
    if (argv[ind][0] == '-') {
      // long options
      if (argv[ind][1] == '-') {
        char *s;
        for (s = &argv[ind][2]; *s != '\0' && *s != '='; s++);
        size_t len = (size_t)(s - &argv[ind][2]);
        if (len == 0) return true;  // stop the scanning

        bool hit = false;
        size_t i = 0;
        for (i = 0; opts[i].name; ++i) {
          size_t nlen = std::strlen(opts[i].name);
          if (nlen == len && std::strncmp(&argv[ind][2],
                                          opts[i].name, len) == 0) {
            hit = true;
            break;
          }
        }

        if (!hit) GOTO_ERROR(0);

        if (opts[i].arg_description) {
          if (*s == '=') {
            set<std::string>(opts[i].name, s+1);
          } else {
            if (argc == (ind+1)) GOTO_ERROR(1);
            set<std::string>(opts[i].name, argv[++ind]);
          }
        } else {
          if (*s == '=') GOTO_ERROR(2);
          set<int>(opts[i].name, 1);
        }

        // short options
      } else if (argv[ind][1] != '\0') {
        size_t i = 0;
        bool hit = false;
        for (i = 0; opts[i].name; ++i) {
          if (opts[i].short_name == argv[ind][1]) {
            hit = true;
            break;
          }
        }

        if (!hit) GOTO_ERROR(0);

        if (opts[i].arg_description) {
          if (argv[ind][2] != '\0') {
            set<std::string>(opts[i].name, &argv[ind][2]);
          } else {
            if (argc == (ind+1)) GOTO_ERROR(1);
            set<std::string>(opts[i].name, argv[++ind]);
          }
        } else {
          if (argv[ind][2] != '\0') GOTO_ERROR(2);
          set<int>(opts[i].name, 1);
        }
      }
    } else {
      rest_.push_back(std::string(argv[ind]));  // others
    }
  }

  return true;

ERROR:
  switch (_errno) {
    case 0: WHAT << "unrecognized option `" << argv[ind] << "`"; break;
    case 1: WHAT << "`" << argv[ind] << "` requires an argument";  break;
    case 2: WHAT << "`" << argv[ind] << "` doesn't allow an argument"; break;
  }
  return false;
}